

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O1

void tvm::runtime::NDArray::Internal::DefaultDeleter(Container *ptr)

{
  int *piVar1;
  void *pvVar2;
  TVMContext ctx;
  pointer plVar3;
  DeviceAPI *pDVar4;
  
  pvVar2 = ptr->manager_ctx;
  if (pvVar2 == (void *)0x0) {
    if ((ptr->dl_tensor).data != (void *)0x0) {
      ctx.device_type = (ptr->dl_tensor).ctx.device_type;
      ctx.device_id = (ptr->dl_tensor).ctx.device_id;
      pDVar4 = DeviceAPI::Get(ctx,false);
      (*pDVar4->_vptr_DeviceAPI[5])(pDVar4,(ptr->dl_tensor).ctx,(ptr->dl_tensor).data);
    }
  }
  else {
    LOCK();
    piVar1 = (int *)((long)pvVar2 + 0x44);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (*(code **)((long)pvVar2 + 0x38) != (code *)0x0)) {
      (**(code **)((long)pvVar2 + 0x38))();
    }
  }
  if (ptr != (Container *)0x0) {
    plVar3 = (ptr->shape_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (plVar3 != (pointer)0x0) {
      operator_delete(plVar3,(long)(ptr->shape_).super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar3)
      ;
    }
    operator_delete(ptr,0x60);
    return;
  }
  return;
}

Assistant:

static void DefaultDeleter(NDArray::Container *ptr) {
    using tvm::runtime::NDArray;
    if (ptr->manager_ctx != nullptr) {
      static_cast<NDArray::Container *>(ptr->manager_ctx)->DecRef();
    } else if (ptr->dl_tensor.data != nullptr) {
      tvm::runtime::DeviceAPI::Get(ptr->dl_tensor.ctx)->FreeDataSpace(ptr->dl_tensor.ctx, ptr->dl_tensor.data);
    }
    delete ptr;
  }